

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapeTetra>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  long *plVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  undefined1 auVar5 [16];
  TPZVec<int> *pTVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  TPZManVector<int,_27> scalarOrders;
  undefined8 local_160;
  undefined8 local_158;
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  ulong local_138;
  undefined8 local_130;
  int aiStack_128 [26];
  undefined1 local_c0 [16];
  ulong uStack_b0;
  ulong local_a8;
  int local_a0 [28];
  long lVar13;
  
  local_148 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840b58;
  uVar10 = ids->fNElements;
  local_158 = connectorders;
  if ((long)uVar10 < 9) {
    local_148._0_8_ = &local_130;
    local_138 = 0;
  }
  else {
    local_148._0_8_ = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
    local_138 = uVar10;
  }
  if (0 < (long)uVar10) {
    plVar1 = ids->fStore;
    uVar8 = 0;
    do {
      *(long *)(local_148._0_8_ + uVar8 * 8) = plVar1[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  local_148._8_8_ = uVar10;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)local_150);
  if ((undefined8 *)local_148._0_8_ == &local_130) {
    local_148._0_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZVec_0183b5f0;
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete__((void *)local_148._0_8_);
  }
  local_148 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840040;
  uVar10 = sideorient->fNElements;
  if ((long)uVar10 < 0x15) {
    local_148._0_8_ = &local_130;
    local_138 = 0;
  }
  else {
    local_148._0_8_ = operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
    local_138 = uVar10;
  }
  if (0 < (long)uVar10) {
    piVar2 = sideorient->fStore;
    uVar8 = 0;
    do {
      *(int *)(local_148._0_8_ + uVar8 * 4) = piVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  local_148._8_8_ = uVar10;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)local_150);
  pTVar6 = local_158;
  if ((undefined8 *)local_148._0_8_ == &local_130) {
    local_148._0_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZVec_0183b5b0;
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete__((void *)local_148._0_8_);
  }
  iVar11 = pTVar6->fStore[4] + 1;
  TPZVec<int>::TPZVec((TPZVec<int> *)local_150,0);
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840098;
  local_148._8_8_ = 0xb;
  local_148._0_8_ = &local_130;
  local_138 = 0;
  lVar7 = 0xb;
  auVar12 = _DAT_014f8b30;
  auVar14 = _DAT_014f8340;
  do {
    if (SUB164(auVar14 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar14 ^ _DAT_014f8350,0) < -0x7ffffff5) {
      *(int *)((long)&local_160 + lVar7 * 4 + 4) = iVar11;
      *(int *)((long)&local_158 + lVar7 * 4) = iVar11;
    }
    if (SUB164(auVar12 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar12 ^ _DAT_014f8350,0) < -0x7ffffff5) {
      *(int *)((long)&local_158 + lVar7 * 4 + 4) = iVar11;
      *(int *)(local_148 + lVar7 * 4 + -8) = iVar11;
    }
    lVar13 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 4;
    auVar14._8_8_ = lVar13 + 4;
    lVar13 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 4;
    auVar12._8_8_ = lVar13 + 4;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x17);
  local_160 = &PTR__TPZVec_0183b5b0;
  TPZShapeH1<pzshape::TPZShapeTetra>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,(TPZVec<int> *)local_150,data);
  pTVar6 = local_158;
  if (local_158->fNElements == 5) {
    stack0xffffffffffffff48 = (undefined1  [16])0x0;
    local_a8 = 0;
    local_c0._0_8_ = &PTR__TPZManVector_01840098;
    uVar10 = local_158->fNElements;
    if ((long)uVar10 < 0x1c) {
      local_c0._8_8_ = local_a0;
      local_a8 = 0;
    }
    else {
      local_c0._8_8_ = operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
      local_a8 = uVar10;
    }
    if (0 < (long)uVar10) {
      piVar2 = pTVar6->fStore;
      uVar8 = 0;
      do {
        *(int *)(local_c0._8_8_ + uVar8 * 4) = piVar2[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
    uStack_b0 = uVar10;
    TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)local_c0);
    if ((int *)local_c0._8_8_ == local_a0) {
      local_c0._8_8_ = (int *)0x0;
    }
    local_a8 = 0;
    local_c0._0_8_ = &PTR__TPZVec_0183b5b0;
    if ((int *)local_c0._8_8_ != (int *)0x0) {
      operator_delete__((void *)local_c0._8_8_);
    }
    TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,5);
    piVar2 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
    piVar3 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
    lVar7 = 0;
    iVar11 = 0;
    do {
      iVar9 = piVar2[lVar7];
      iVar4 = (iVar9 + 2) * iVar9;
      if (lVar7 != 4) {
        iVar4 = iVar9 + 1;
      }
      iVar9 = (int)((iVar9 + (uint)(lVar7 == 4) + 2) * iVar4) / 2;
      piVar3[lVar7] = iVar9;
      iVar11 = iVar11 + iVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar11);
    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    iVar11 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
    if (1 < (long)iVar11) {
      uVar10 = 0;
      do {
        if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar11 + -1] <
            (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar10]) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                     ,0x3e);
        }
        uVar10 = uVar10 + 1;
      } while (iVar11 - 1 != uVar10);
    }
    if ((undefined8 *)local_148._0_8_ == &local_130) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_148._8_8_;
      local_148 = auVar5 << 0x40;
    }
    local_138 = 0;
    local_150 = (undefined1  [8])local_160;
    if ((long *)local_148._0_8_ != (long *)0x0) {
      operator_delete__((void *)local_148._0_8_);
    }
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x26);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}